

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall front::irGenerator::irGenerator::ir_begin_of_program(irGenerator *this)

{
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_00;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_01;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_02;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_03;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_04;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_05;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_06;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_07;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_08;
  initializer_list<std::shared_ptr<mir::types::Ty>_> __l_09;
  bool bVar1;
  reference pbVar2;
  element_type *peVar3;
  long in_RDI;
  string trueName_2;
  string trueName_1;
  string trueName;
  shared_ptr<mir::types::FunctionTy> type;
  shared_ptr<mir::inst::MirFunction> func;
  string funcName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  MirFunction *in_stack_ffffffffffffeab8;
  Variable *in_stack_ffffffffffffeac0;
  iterator in_stack_ffffffffffffeac8;
  Variable *in_stack_ffffffffffffead0;
  SharedTyPtr *in_stack_ffffffffffffead8;
  PtrTy *in_stack_ffffffffffffeae0;
  iterator in_stack_ffffffffffffeae8;
  MirFunction *in_stack_ffffffffffffeaf0;
  iterator in_stack_ffffffffffffeaf8;
  FunctionTy *in_stack_ffffffffffffeb00;
  string *in_stack_ffffffffffffeb30;
  irGenerator *in_stack_ffffffffffffeb38;
  shared_ptr<mir::inst::MirFunction> *in_stack_ffffffffffffec90;
  string *in_stack_ffffffffffffec98;
  undefined7 in_stack_ffffffffffffeca0;
  undefined1 in_stack_ffffffffffffeca7;
  undefined1 ***local_1280;
  undefined1 ***local_1210;
  undefined1 ***local_1180;
  void *in_stack_ffffffffffffeea0;
  SymbolKind kind;
  string *in_stack_ffffffffffffeea8;
  irGenerator *in_stack_ffffffffffffeeb0;
  undefined1 ***local_1100;
  undefined1 ***local_1090;
  undefined1 ***local_1028;
  undefined1 ***local_fc0;
  undefined1 ***local_f40;
  undefined1 ***local_ec0;
  undefined1 ***local_e58;
  undefined1 ***local_df0;
  string local_d68 [32];
  string local_d48 [32];
  string local_d28 [32];
  _Base_ptr local_d08;
  undefined1 local_d00 [48];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  _Base_ptr local_c70;
  undefined1 local_c68 [48];
  string local_c38 [39];
  allocator<char> local_c11;
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  _Base_ptr local_bb0;
  undefined1 local_ba8 [48];
  string local_b78 [39];
  undefined1 local_b51 [33];
  string local_b30 [32];
  string local_b10 [32];
  _Base_ptr local_af0;
  string local_ad8 [32];
  string local_ab8 [39];
  allocator<char> local_a91;
  string local_a90 [32];
  undefined4 local_a70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a69 [7];
  undefined4 local_9ec;
  undefined4 local_9b8;
  undefined1 local_9b1;
  undefined4 local_96c;
  undefined4 local_934;
  undefined4 local_8fc;
  undefined4 local_8c8;
  undefined1 local_8c1;
  undefined4 local_880;
  undefined1 local_879;
  undefined4 local_834;
  undefined4 local_800;
  undefined1 local_7f9;
  undefined4 local_7b8;
  undefined1 local_7b1;
  undefined4 local_76c;
  undefined4 local_734;
  undefined4 local_6fc;
  undefined4 local_6c8;
  undefined1 local_6c1;
  undefined1 local_679;
  string local_668 [52];
  undefined1 local_634;
  undefined1 local_632;
  undefined1 local_631;
  undefined8 **local_620;
  undefined1 **local_618 [2];
  undefined8 **local_608;
  undefined8 local_600;
  undefined1 local_5bc;
  undefined1 local_5ba;
  undefined1 local_5b9;
  undefined8 **local_5a8;
  undefined1 **local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined8 **local_570;
  undefined8 local_568;
  undefined1 local_522;
  undefined8 **local_520;
  undefined1 **local_518 [2];
  undefined1 local_508 [16];
  undefined8 **local_4f8;
  undefined8 local_4f0;
  undefined1 local_4c9;
  undefined1 local_492;
  undefined8 **local_490;
  undefined1 **local_488 [2];
  undefined8 **local_478;
  undefined8 local_470;
  undefined1 local_449;
  undefined1 local_412;
  undefined8 **local_410;
  undefined1 **local_408 [2];
  undefined8 **local_3f8;
  undefined8 local_3f0;
  undefined1 local_3aa;
  undefined8 **local_3a8;
  undefined1 **local_3a0 [2];
  undefined8 **local_390;
  undefined8 local_388;
  undefined1 local_344;
  undefined1 local_342;
  undefined1 local_341;
  undefined8 **local_330;
  undefined1 **local_328 [2];
  undefined1 local_318 [16];
  undefined8 **local_308;
  undefined8 local_300;
  undefined1 local_2bc;
  undefined1 local_2ba;
  undefined1 local_2b9;
  undefined8 **local_2a8;
  undefined1 **local_2a0 [2];
  undefined1 local_290 [16];
  undefined8 **local_280;
  undefined8 local_278;
  undefined1 local_232;
  undefined8 **local_230;
  undefined1 **local_228 [2];
  undefined8 **local_218;
  undefined8 local_210;
  undefined1 local_1ca;
  undefined8 **local_1c8;
  undefined1 **local_1c0 [2];
  undefined8 **local_1b0;
  undefined8 local_1a8;
  undefined1 local_164;
  undefined1 local_162;
  undefined1 local_161;
  undefined8 **local_150;
  undefined1 **local_148 [2];
  undefined8 **local_138;
  undefined8 local_130;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  undefined1 *local_10;
  
  local_10 = externalFuncName_abi_cxx11_;
  local_18._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffeab8);
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeab8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffeac0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffeab8);
    kind = (SymbolKind)((ulong)in_stack_ffffffffffffeea0 >> 0x20);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_18);
    std::__cxx11::string::string(local_40,(string *)pbVar2);
    std::shared_ptr<mir::inst::MirFunction>::shared_ptr
              ((shared_ptr<mir::inst::MirFunction> *)0x2556c6);
    std::shared_ptr<mir::types::FunctionTy>::shared_ptr
              ((shared_ptr<mir::types::FunctionTy> *)0x2556d3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
    if (bVar1) {
      operator_new(0x38);
      local_a9 = 1;
      operator_new(8);
      mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                 (IntTy *)in_stack_ffffffffffffeab8);
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      std::
      vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
      vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
              *)0x255782);
      mir::types::FunctionTy::FunctionTy
                (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                 (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  *)in_stack_ffffffffffffeaf0,
                 SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
      local_a9 = 0;
      std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                 (FunctionTy *)in_stack_ffffffffffffeab8);
      std::shared_ptr<mir::types::FunctionTy>::operator=
                ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                 (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
      std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                ((shared_ptr<mir::types::FunctionTy> *)0x2557e7);
      std::
      vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
      ~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
               *)in_stack_ffffffffffffead0);
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x255801);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
      if (bVar1) {
        operator_new(0x38);
        local_e9 = 1;
        operator_new(8);
        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                   (IntTy *)in_stack_ffffffffffffeab8);
        local_e8 = 0;
        uStack_e0 = 0;
        local_d8 = 0;
        std::
        vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
        vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                *)0x25595d);
        mir::types::FunctionTy::FunctionTy
                  (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                   (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    *)in_stack_ffffffffffffeaf0,
                   SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
        local_e9 = 0;
        std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                  ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                   (FunctionTy *)in_stack_ffffffffffffeab8);
        std::shared_ptr<mir::types::FunctionTy>::operator=
                  ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                   (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
        std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                  ((shared_ptr<mir::types::FunctionTy> *)0x2559c2);
        std::
        vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
        ~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 *)in_stack_ffffffffffffead0);
        std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2559dc);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
        if (bVar1) {
          operator_new(0x38);
          local_164 = 1;
          operator_new(8);
          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                     (IntTy *)in_stack_ffffffffffffeab8);
          local_162 = 1;
          local_150 = local_148;
          operator_new(0x18);
          local_161 = 1;
          operator_new(8);
          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                     (IntTy *)in_stack_ffffffffffffeab8);
          mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
          local_161 = 0;
          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                     (PtrTy *)in_stack_ffffffffffffeab8);
          local_162 = 0;
          local_138 = local_148;
          local_130 = 1;
          std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                    ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x255bd0);
          __l._M_len = (size_type)in_stack_ffffffffffffeb00;
          __l._M_array = in_stack_ffffffffffffeaf8;
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    *)in_stack_ffffffffffffeaf0,__l,
                   (allocator_type *)in_stack_ffffffffffffeae8._M_node);
          mir::types::FunctionTy::FunctionTy
                    (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                     (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      *)in_stack_ffffffffffffeaf0,
                     SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
          local_164 = 0;
          std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                    ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                     (FunctionTy *)in_stack_ffffffffffffeab8);
          std::shared_ptr<mir::types::FunctionTy>::operator=
                    ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                     (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
          std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                    ((shared_ptr<mir::types::FunctionTy> *)0x255c5c);
          std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                     *)in_stack_ffffffffffffead0);
          std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                    ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x255c76);
          local_df0 = (undefined1 ***)&local_138;
          do {
            local_df0 = local_df0 + -2;
            std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x255cab);
          } while (local_df0 != local_148);
          std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x255cd5);
          std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x255ce2);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
          if (bVar1) {
            operator_new(0x38);
            local_1ca = 1;
            operator_new(8);
            mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                       (VoidTy *)in_stack_ffffffffffffeab8);
            local_1c8 = local_1c0;
            operator_new(8);
            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                       (IntTy *)in_stack_ffffffffffffeab8);
            local_1b0 = local_1c0;
            local_1a8 = 1;
            std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                      ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x255ff5);
            __l_00._M_len = (size_type)in_stack_ffffffffffffeb00;
            __l_00._M_array = in_stack_ffffffffffffeaf8;
            std::
            vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
            ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      *)in_stack_ffffffffffffeaf0,__l_00,
                     (allocator_type *)in_stack_ffffffffffffeae8._M_node);
            mir::types::FunctionTy::FunctionTy
                      (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                       (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        *)in_stack_ffffffffffffeaf0,
                       SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
            local_1ca = 0;
            std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                      ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                       (FunctionTy *)in_stack_ffffffffffffeab8);
            std::shared_ptr<mir::types::FunctionTy>::operator=
                      ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                       (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
            std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                      ((shared_ptr<mir::types::FunctionTy> *)0x256081);
            std::
            vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
            ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                       *)in_stack_ffffffffffffead0);
            std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                      ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25609b);
            local_e58 = (undefined1 ***)&local_1b0;
            do {
              local_e58 = local_e58 + -2;
              std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2560d0);
            } while (local_e58 != local_1c0);
            std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2560fa);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
            if (bVar1) {
              operator_new(0x38);
              local_232 = 1;
              operator_new(8);
              mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                         (VoidTy *)in_stack_ffffffffffffeab8);
              local_230 = local_228;
              operator_new(8);
              mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                         (IntTy *)in_stack_ffffffffffffeab8);
              local_218 = local_228;
              local_210 = 1;
              std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                        ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25639d);
              __l_01._M_len = (size_type)in_stack_ffffffffffffeb00;
              __l_01._M_array = in_stack_ffffffffffffeaf8;
              std::
              vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
              ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        *)in_stack_ffffffffffffeaf0,__l_01,
                       (allocator_type *)in_stack_ffffffffffffeae8._M_node);
              mir::types::FunctionTy::FunctionTy
                        (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                         (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          *)in_stack_ffffffffffffeaf0,
                         SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
              local_232 = 0;
              std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                        ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                         (FunctionTy *)in_stack_ffffffffffffeab8);
              std::shared_ptr<mir::types::FunctionTy>::operator=
                        ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                         (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
              std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                        ((shared_ptr<mir::types::FunctionTy> *)0x256429);
              std::
              vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
              ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                         *)in_stack_ffffffffffffead0);
              std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                        ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x256443);
              local_ec0 = (undefined1 ***)&local_218;
              do {
                local_ec0 = local_ec0 + -2;
                std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x256478)
                ;
              } while (local_ec0 != local_228);
              std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2564a2);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8
                                     );
              if (bVar1) {
                operator_new(0x38);
                local_2bc = 1;
                operator_new(8);
                mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (VoidTy *)in_stack_ffffffffffffeab8);
                local_2ba = 1;
                local_2a8 = local_2a0;
                operator_new(8);
                mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (IntTy *)in_stack_ffffffffffffeab8);
                local_2a8 = (undefined8 **)local_290;
                operator_new(0x18);
                local_2b9 = 1;
                operator_new(8);
                mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (IntTy *)in_stack_ffffffffffffeab8);
                mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                local_2b9 = 0;
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (PtrTy *)in_stack_ffffffffffffeab8);
                local_2ba = 0;
                local_280 = local_2a0;
                local_278 = 2;
                std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                          ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2567f9);
                __l_02._M_len = (size_type)in_stack_ffffffffffffeb00;
                __l_02._M_array = in_stack_ffffffffffffeaf8;
                std::
                vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          *)in_stack_ffffffffffffeaf0,__l_02,
                         (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                mir::types::FunctionTy::FunctionTy
                          (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                           (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                            *)in_stack_ffffffffffffeaf0,
                           SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                local_2bc = 0;
                std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                          ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                           (FunctionTy *)in_stack_ffffffffffffeab8);
                std::shared_ptr<mir::types::FunctionTy>::operator=
                          ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                           (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
                std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                          ((shared_ptr<mir::types::FunctionTy> *)0x256885);
                std::
                vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                           *)in_stack_ffffffffffffead0);
                std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                          ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25689f);
                local_f40 = (undefined1 ***)&local_280;
                do {
                  local_f40 = local_f40 + -2;
                  std::shared_ptr<mir::types::Ty>::~shared_ptr
                            ((shared_ptr<mir::types::Ty> *)0x2568d4);
                } while (local_f40 != local_2a0);
                std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2568fe)
                ;
                std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25690b)
                ;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffeac0,
                                        (char *)in_stack_ffffffffffffeab8);
                if (bVar1) {
                  operator_new(0x38);
                  local_344 = 1;
                  operator_new(8);
                  mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (VoidTy *)in_stack_ffffffffffffeab8);
                  local_342 = 1;
                  local_330 = local_328;
                  operator_new(0x18);
                  local_341 = 1;
                  operator_new(8);
                  mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (IntTy *)in_stack_ffffffffffffeab8);
                  mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                  local_341 = 0;
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (PtrTy *)in_stack_ffffffffffffeab8);
                  local_330 = (undefined8 **)local_318;
                  operator_new(8);
                  mir::types::RestParamTy::RestParamTy((RestParamTy *)in_stack_ffffffffffffeac0);
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::RestParamTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (RestParamTy *)in_stack_ffffffffffffeab8);
                  local_342 = 0;
                  local_308 = local_328;
                  local_300 = 2;
                  std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                            ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x256cfd);
                  __l_03._M_len = (size_type)in_stack_ffffffffffffeb00;
                  __l_03._M_array = in_stack_ffffffffffffeaf8;
                  std::
                  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                            *)in_stack_ffffffffffffeaf0,__l_03,
                           (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                  mir::types::FunctionTy::FunctionTy
                            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                             (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                              *)in_stack_ffffffffffffeaf0,
                             SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                  local_344 = 0;
                  std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                            ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                             (FunctionTy *)in_stack_ffffffffffffeab8);
                  std::shared_ptr<mir::types::FunctionTy>::operator=
                            ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                             (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
                  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                            ((shared_ptr<mir::types::FunctionTy> *)0x256d89);
                  std::
                  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                             *)in_stack_ffffffffffffead0);
                  std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                            ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x256da3);
                  local_fc0 = (undefined1 ***)&local_308;
                  do {
                    local_fc0 = local_fc0 + -2;
                    std::shared_ptr<mir::types::Ty>::~shared_ptr
                              ((shared_ptr<mir::types::Ty> *)0x256dd8);
                  } while (local_fc0 != local_328);
                  std::shared_ptr<mir::types::Ty>::~shared_ptr
                            ((shared_ptr<mir::types::Ty> *)0x256e02);
                  std::shared_ptr<mir::types::Ty>::~shared_ptr
                            ((shared_ptr<mir::types::Ty> *)0x256e0f);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffeac0,
                                          (char *)in_stack_ffffffffffffeab8);
                  if (bVar1) {
                    operator_new(0x38);
                    local_3aa = 1;
                    operator_new(8);
                    mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                              ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                               (VoidTy *)in_stack_ffffffffffffeab8);
                    local_3a8 = local_3a0;
                    operator_new(8);
                    mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                              ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                               (IntTy *)in_stack_ffffffffffffeab8);
                    local_390 = local_3a0;
                    local_388 = 1;
                    std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                              ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25714d);
                    __l_04._M_len = (size_type)in_stack_ffffffffffffeb00;
                    __l_04._M_array = in_stack_ffffffffffffeaf8;
                    std::
                    vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                              *)in_stack_ffffffffffffeaf0,__l_04,
                             (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                    mir::types::FunctionTy::FunctionTy
                              (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                               (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                *)in_stack_ffffffffffffeaf0,
                               SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                    local_3aa = 0;
                    std::shared_ptr<mir::types::FunctionTy>::shared_ptr<mir::types::FunctionTy,void>
                              ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                               (FunctionTy *)in_stack_ffffffffffffeab8);
                    std::shared_ptr<mir::types::FunctionTy>::operator=
                              ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                               (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
                    std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                              ((shared_ptr<mir::types::FunctionTy> *)0x2571d9);
                    std::
                    vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                               *)in_stack_ffffffffffffead0);
                    std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                              ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2571f3);
                    local_1028 = (undefined1 ***)&local_390;
                    do {
                      local_1028 = local_1028 + -2;
                      std::shared_ptr<mir::types::Ty>::~shared_ptr
                                ((shared_ptr<mir::types::Ty> *)0x257228);
                    } while (local_1028 != local_3a0);
                    std::shared_ptr<mir::types::Ty>::~shared_ptr
                              ((shared_ptr<mir::types::Ty> *)0x257252);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffeac0,
                                            (char *)in_stack_ffffffffffffeab8);
                    if (bVar1) {
                      operator_new(0x38);
                      local_412 = 1;
                      operator_new(8);
                      mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                 (VoidTy *)in_stack_ffffffffffffeab8);
                      local_410 = local_408;
                      operator_new(8);
                      mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                 (IntTy *)in_stack_ffffffffffffeab8);
                      local_3f8 = local_408;
                      local_3f0 = 1;
                      std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                                ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2574f5);
                      __l_05._M_len = (size_type)in_stack_ffffffffffffeb00;
                      __l_05._M_array = in_stack_ffffffffffffeaf8;
                      std::
                      vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                *)in_stack_ffffffffffffeaf0,__l_05,
                               (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                      mir::types::FunctionTy::FunctionTy
                                (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                                 (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                  *)in_stack_ffffffffffffeaf0,
                                 SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                      local_412 = 0;
                      std::shared_ptr<mir::types::FunctionTy>::
                      shared_ptr<mir::types::FunctionTy,void>
                                ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                                 (FunctionTy *)in_stack_ffffffffffffeab8);
                      std::shared_ptr<mir::types::FunctionTy>::operator=
                                ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                                 (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
                      std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                                ((shared_ptr<mir::types::FunctionTy> *)0x257581);
                      std::
                      vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                      ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                 *)in_stack_ffffffffffffead0);
                      std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                                ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25759b);
                      local_1090 = (undefined1 ***)&local_3f8;
                      do {
                        local_1090 = local_1090 + -2;
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x2575d0);
                      } while (local_1090 != local_408);
                      std::shared_ptr<mir::types::Ty>::~shared_ptr
                                ((shared_ptr<mir::types::Ty> *)0x2575fa);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffeac0,
                                              (char *)in_stack_ffffffffffffeab8);
                      if (bVar1) {
                        operator_new(0x38);
                        local_492 = 1;
                        operator_new(0x18);
                        local_449 = 1;
                        operator_new(8);
                        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (IntTy *)in_stack_ffffffffffffeab8);
                        mir::types::PtrTy::PtrTy
                                  (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                        local_449 = 0;
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (PtrTy *)in_stack_ffffffffffffeab8);
                        local_490 = local_488;
                        operator_new(8);
                        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (IntTy *)in_stack_ffffffffffffeab8);
                        local_478 = local_488;
                        local_470 = 1;
                        std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                                  ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2578ef);
                        __l_06._M_len = (size_type)in_stack_ffffffffffffeb00;
                        __l_06._M_array = in_stack_ffffffffffffeaf8;
                        std::
                        vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                  *)in_stack_ffffffffffffeaf0,__l_06,
                                 (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                        mir::types::FunctionTy::FunctionTy
                                  (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                                   (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                    *)in_stack_ffffffffffffeaf0,
                                   SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                        local_492 = 0;
                        std::shared_ptr<mir::types::FunctionTy>::
                        shared_ptr<mir::types::FunctionTy,void>
                                  ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                                   (FunctionTy *)in_stack_ffffffffffffeab8);
                        std::shared_ptr<mir::types::FunctionTy>::operator=
                                  ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
                                   (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
                        std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                                  ((shared_ptr<mir::types::FunctionTy> *)0x25797b);
                        std::
                        vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                   *)in_stack_ffffffffffffead0);
                        std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                                  ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x257995);
                        local_1100 = (undefined1 ***)&local_478;
                        do {
                          local_1100 = local_1100 + -2;
                          std::shared_ptr<mir::types::Ty>::~shared_ptr
                                    ((shared_ptr<mir::types::Ty> *)0x2579ca);
                        } while (local_1100 != local_488);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x2579f4);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x257a01);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_ffffffffffffeac0,
                                                (char *)in_stack_ffffffffffffeab8);
                        if (bVar1) {
                          operator_new(0x38);
                          local_522 = 1;
                          in_stack_ffffffffffffeeb0 = (irGenerator *)operator_new(0x18);
                          local_4c9 = 1;
                          in_stack_ffffffffffffeea8 = (string *)operator_new(8);
                          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (IntTy *)in_stack_ffffffffffffeab8);
                          mir::types::PtrTy::PtrTy
                                    (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                          local_4c9 = 0;
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (PtrTy *)in_stack_ffffffffffffeab8);
                          local_520 = local_518;
                          in_stack_ffffffffffffeea0 = operator_new(8);
                          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (IntTy *)in_stack_ffffffffffffeab8);
                          local_520 = (undefined8 **)local_508;
                          operator_new(8);
                          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (IntTy *)in_stack_ffffffffffffeab8);
                          local_4f8 = local_518;
                          local_4f0 = 2;
                          std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                                    ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x257da7);
                          __l_07._M_len = (size_type)in_stack_ffffffffffffeb00;
                          __l_07._M_array = in_stack_ffffffffffffeaf8;
                          std::
                          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                    *)in_stack_ffffffffffffeaf0,__l_07,
                                   (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                          mir::types::FunctionTy::FunctionTy
                                    (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                                     (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                      *)in_stack_ffffffffffffeaf0,
                                     SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                          local_522 = 0;
                          std::shared_ptr<mir::types::FunctionTy>::
                          shared_ptr<mir::types::FunctionTy,void>
                                    ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0
                                     ,(FunctionTy *)in_stack_ffffffffffffeab8);
                          std::shared_ptr<mir::types::FunctionTy>::operator=
                                    ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0
                                     ,(shared_ptr<mir::types::FunctionTy> *)
                                      in_stack_ffffffffffffeab8);
                          std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                                    ((shared_ptr<mir::types::FunctionTy> *)0x257e33);
                          std::
                          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                     *)in_stack_ffffffffffffead0);
                          std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                                    ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x257e4d);
                          local_1180 = (undefined1 ***)&local_4f8;
                          do {
                            local_1180 = local_1180 + -2;
                            std::shared_ptr<mir::types::Ty>::~shared_ptr
                                      ((shared_ptr<mir::types::Ty> *)0x257e82);
                          } while (local_1180 != local_518);
                          std::shared_ptr<mir::types::Ty>::~shared_ptr
                                    ((shared_ptr<mir::types::Ty> *)0x257eac);
                          std::shared_ptr<mir::types::Ty>::~shared_ptr
                                    ((shared_ptr<mir::types::Ty> *)0x257eb9);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeac0,
                                                  (char *)in_stack_ffffffffffffeab8);
                          if (bVar1) {
                            operator_new(0x38);
                            local_5bc = 1;
                            operator_new(8);
                            mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                       (VoidTy *)in_stack_ffffffffffffeab8);
                            local_5ba = 1;
                            local_5a8 = local_5a0;
                            operator_new(0x18);
                            local_5b9 = 1;
                            operator_new(8);
                            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                       (IntTy *)in_stack_ffffffffffffeab8);
                            mir::types::PtrTy::PtrTy
                                      (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                            local_5b9 = 0;
                            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                       (PtrTy *)in_stack_ffffffffffffeab8);
                            local_5a8 = (undefined8 **)local_590;
                            operator_new(8);
                            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                       (IntTy *)in_stack_ffffffffffffeab8);
                            local_5a8 = (undefined8 **)local_580;
                            operator_new(8);
                            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                       (IntTy *)in_stack_ffffffffffffeab8);
                            local_5ba = 0;
                            local_570 = local_5a0;
                            local_568 = 3;
                            std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                                      ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2582e9);
                            __l_08._M_len = (size_type)in_stack_ffffffffffffeb00;
                            __l_08._M_array = in_stack_ffffffffffffeaf8;
                            std::
                            vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                            ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                      *)in_stack_ffffffffffffeaf0,__l_08,
                                     (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                            mir::types::FunctionTy::FunctionTy
                                      (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                                       (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                        *)in_stack_ffffffffffffeaf0,
                                       SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                            local_5bc = 0;
                            std::shared_ptr<mir::types::FunctionTy>::
                            shared_ptr<mir::types::FunctionTy,void>
                                      ((shared_ptr<mir::types::FunctionTy> *)
                                       in_stack_ffffffffffffeac0,
                                       (FunctionTy *)in_stack_ffffffffffffeab8);
                            std::shared_ptr<mir::types::FunctionTy>::operator=
                                      ((shared_ptr<mir::types::FunctionTy> *)
                                       in_stack_ffffffffffffeac0,
                                       (shared_ptr<mir::types::FunctionTy> *)
                                       in_stack_ffffffffffffeab8);
                            std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                                      ((shared_ptr<mir::types::FunctionTy> *)0x258375);
                            std::
                            vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                            ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                       *)in_stack_ffffffffffffead0);
                            std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                                      ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25838f);
                            local_1210 = (undefined1 ***)&local_570;
                            do {
                              local_1210 = local_1210 + -2;
                              std::shared_ptr<mir::types::Ty>::~shared_ptr
                                        ((shared_ptr<mir::types::Ty> *)0x2583c4);
                            } while (local_1210 != local_5a0);
                            std::shared_ptr<mir::types::Ty>::~shared_ptr
                                      ((shared_ptr<mir::types::Ty> *)0x2583ee);
                            std::shared_ptr<mir::types::Ty>::~shared_ptr
                                      ((shared_ptr<mir::types::Ty> *)0x2583fb);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_ffffffffffffeac0,
                                                  (char *)in_stack_ffffffffffffeab8);
                            if (bVar1) {
                              operator_new(0x38);
                              local_634 = 1;
                              operator_new(8);
                              mir::types::VoidTy::VoidTy((VoidTy *)in_stack_ffffffffffffeac0);
                              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::VoidTy,void>
                                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                         (VoidTy *)in_stack_ffffffffffffeab8);
                              local_632 = 1;
                              local_620 = local_618;
                              operator_new(0x18);
                              local_631 = 1;
                              operator_new(8);
                              mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                         (IntTy *)in_stack_ffffffffffffeab8);
                              mir::types::PtrTy::PtrTy
                                        (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                              local_631 = 0;
                              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                         (PtrTy *)in_stack_ffffffffffffeab8);
                              local_632 = 0;
                              local_608 = local_618;
                              local_600 = 1;
                              std::allocator<std::shared_ptr<mir::types::Ty>_>::allocator
                                        ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x2587c6);
                              __l_09._M_len = (size_type)in_stack_ffffffffffffeb00;
                              __l_09._M_array = in_stack_ffffffffffffeaf8;
                              std::
                              vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                              ::vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                        *)in_stack_ffffffffffffeaf0,__l_09,
                                       (allocator_type *)in_stack_ffffffffffffeae8._M_node);
                              mir::types::FunctionTy::FunctionTy
                                        (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
                                         (vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                          *)in_stack_ffffffffffffeaf0,
                                         SUB81((ulong)in_stack_ffffffffffffeae8._M_node >> 0x38,0));
                              local_634 = 0;
                              std::shared_ptr<mir::types::FunctionTy>::
                              shared_ptr<mir::types::FunctionTy,void>
                                        ((shared_ptr<mir::types::FunctionTy> *)
                                         in_stack_ffffffffffffeac0,
                                         (FunctionTy *)in_stack_ffffffffffffeab8);
                              std::shared_ptr<mir::types::FunctionTy>::operator=
                                        ((shared_ptr<mir::types::FunctionTy> *)
                                         in_stack_ffffffffffffeac0,
                                         (shared_ptr<mir::types::FunctionTy> *)
                                         in_stack_ffffffffffffeab8);
                              std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
                                        ((shared_ptr<mir::types::FunctionTy> *)0x258852);
                              std::
                              vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                              ::~vector((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                                         *)in_stack_ffffffffffffead0);
                              std::allocator<std::shared_ptr<mir::types::Ty>_>::~allocator
                                        ((allocator<std::shared_ptr<mir::types::Ty>_> *)0x25886c);
                              local_1280 = (undefined1 ***)&local_608;
                              do {
                                local_1280 = local_1280 + -2;
                                std::shared_ptr<mir::types::Ty>::~shared_ptr
                                          ((shared_ptr<mir::types::Ty> *)0x2588a1);
                              } while (local_1280 != local_618);
                              std::shared_ptr<mir::types::Ty>::~shared_ptr
                                        ((shared_ptr<mir::types::Ty> *)0x2588cb);
                              std::shared_ptr<mir::types::Ty>::~shared_ptr
                                        ((shared_ptr<mir::types::Ty> *)0x2588d8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    operator_new(0x98);
    local_679 = 1;
    std::__cxx11::string::string(local_668,local_40);
    std::shared_ptr<mir::types::FunctionTy>::shared_ptr
              ((shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeac0,
               (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeab8);
    mir::inst::MirFunction::MirFunction
              (in_stack_ffffffffffffeaf0,(string *)in_stack_ffffffffffffeae8._M_node,
               (shared_ptr<mir::types::FunctionTy> *)in_stack_ffffffffffffeae0);
    local_679 = 0;
    std::shared_ptr<mir::inst::MirFunction>::shared_ptr<mir::inst::MirFunction,void>
              ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
               in_stack_ffffffffffffeab8);
    std::shared_ptr<mir::inst::MirFunction>::operator=
              ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
               (shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeab8);
    std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
              ((shared_ptr<mir::inst::MirFunction> *)0x258bbd);
    std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
              ((shared_ptr<mir::types::FunctionTy> *)0x258bca);
    std::__cxx11::string::~string(local_668);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
    if (bVar1) {
      operator_new(0x18);
      local_6c1 = 1;
      operator_new(8);
      mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                 (IntTy *)in_stack_ffffffffffffeab8);
      mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
      local_6c1 = 0;
      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                 (PtrTy *)in_stack_ffffffffffffeab8);
      mir::inst::Variable::Variable
                (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
      std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x258cbf);
      local_6c8 = 1;
      std::
      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)in_stack_ffffffffffffeb00,(key_type_conflict *)in_stack_ffffffffffffeaf8);
      mir::inst::Variable::operator=
                (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
      mir::inst::Variable::~Variable((Variable *)0x258d0a);
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x258d17);
      std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x258d24);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
      if (bVar1) {
        operator_new(8);
        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                   (IntTy *)in_stack_ffffffffffffeab8);
        mir::inst::Variable::Variable
                  (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
        std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x258ef1);
        local_6fc = 1;
        std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      *)in_stack_ffffffffffffeb00,(key_type_conflict *)in_stack_ffffffffffffeaf8);
        mir::inst::Variable::operator=
                  (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
        mir::inst::Variable::~Variable((Variable *)0x258f3c);
        std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x258f49);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
        if (bVar1) {
          operator_new(8);
          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                     (IntTy *)in_stack_ffffffffffffeab8);
          mir::inst::Variable::Variable
                    (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
          std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x259058);
          local_734 = 1;
          std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        *)in_stack_ffffffffffffeb00,(key_type_conflict *)in_stack_ffffffffffffeaf8);
          mir::inst::Variable::operator=
                    (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
          mir::inst::Variable::~Variable((Variable *)0x2590a3);
          std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2590b0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
          if (bVar1) {
            operator_new(8);
            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                       (IntTy *)in_stack_ffffffffffffeab8);
            mir::inst::Variable::Variable
                      (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
            std::
            __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2591bf);
            local_76c = 1;
            std::
            map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)in_stack_ffffffffffffeb00,(key_type_conflict *)in_stack_ffffffffffffeaf8
                        );
            mir::inst::Variable::operator=
                      (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
            mir::inst::Variable::~Variable((Variable *)0x259212);
            std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25921f);
            operator_new(0x18);
            local_7b1 = 1;
            operator_new(8);
            mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                       (IntTy *)in_stack_ffffffffffffeab8);
            mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
            local_7b1 = 0;
            std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                      ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                       (PtrTy *)in_stack_ffffffffffffeab8);
            mir::inst::Variable::Variable
                      (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                       SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
            std::
            __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2592da);
            local_7b8 = 2;
            std::
            map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)in_stack_ffffffffffffeb00,(key_type_conflict *)in_stack_ffffffffffffeaf8
                        );
            mir::inst::Variable::operator=
                      (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
            mir::inst::Variable::~Variable((Variable *)0x259325);
            std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x259332);
            std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25933f);
          }
          else {
            in_stack_ffffffffffffeca7 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
            if ((bool)in_stack_ffffffffffffeca7) {
              in_stack_ffffffffffffec98 = (string *)operator_new(0x18);
              local_7f9 = 1;
              in_stack_ffffffffffffec90 = (shared_ptr<mir::inst::MirFunction> *)operator_new(8);
              mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                         (IntTy *)in_stack_ffffffffffffeab8);
              mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
              local_7f9 = 0;
              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                         (PtrTy *)in_stack_ffffffffffffeab8);
              mir::inst::Variable::Variable
                        (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
              std::
              __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x25956b);
              local_800 = 1;
              std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)in_stack_ffffffffffffeb00,
                           (key_type_conflict *)in_stack_ffffffffffffeaf8);
              mir::inst::Variable::operator=
                        (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
              mir::inst::Variable::~Variable((Variable *)0x2595be);
              std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2595cb);
              std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x2595d8);
              operator_new(8);
              mir::types::RestParamTy::RestParamTy((RestParamTy *)in_stack_ffffffffffffeac0);
              std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::RestParamTy,void>
                        ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                         (RestParamTy *)in_stack_ffffffffffffeab8);
              mir::inst::Variable::Variable
                        (in_stack_ffffffffffffead0,(SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                         SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
              std::
              __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x259641);
              local_834 = 2;
              std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)in_stack_ffffffffffffeb00,
                           (key_type_conflict *)in_stack_ffffffffffffeaf8);
              mir::inst::Variable::operator=
                        (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
              mir::inst::Variable::~Variable((Variable *)0x25968c);
              std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x259699);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8
                                     );
              if (bVar1) {
                operator_new(0x18);
                local_879 = 1;
                operator_new(8);
                mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (IntTy *)in_stack_ffffffffffffeab8);
                mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                local_879 = 0;
                std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                          ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                           (PtrTy *)in_stack_ffffffffffffeab8);
                mir::inst::Variable::Variable
                          (in_stack_ffffffffffffead0,
                           (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                           SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                           SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                           SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                std::
                __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2598c5);
                local_880 = 1;
                std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)in_stack_ffffffffffffeb00,
                             (key_type_conflict *)in_stack_ffffffffffffeaf8);
                mir::inst::Variable::operator=
                          (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                mir::inst::Variable::~Variable((Variable *)0x259910);
                std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25991d)
                ;
                std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x25992a)
                ;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffeac0,
                                        (char *)in_stack_ffffffffffffeab8);
                if (bVar1) {
                  operator_new(0x18);
                  local_8c1 = 1;
                  operator_new(8);
                  mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (IntTy *)in_stack_ffffffffffffeab8);
                  mir::types::PtrTy::PtrTy(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                  local_8c1 = 0;
                  std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                            ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                             (PtrTy *)in_stack_ffffffffffffeab8);
                  mir::inst::Variable::Variable
                            (in_stack_ffffffffffffead0,
                             (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                             SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                             SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                             SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                  std::
                  __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x259ae2);
                  local_8c8 = 1;
                  std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)in_stack_ffffffffffffeb00,
                               (key_type_conflict *)in_stack_ffffffffffffeaf8);
                  mir::inst::Variable::operator=
                            (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                  mir::inst::Variable::~Variable((Variable *)0x259b2d);
                  std::shared_ptr<mir::types::Ty>::~shared_ptr
                            ((shared_ptr<mir::types::Ty> *)0x259b3a);
                  std::shared_ptr<mir::types::Ty>::~shared_ptr
                            ((shared_ptr<mir::types::Ty> *)0x259b47);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffeac0,
                                          (char *)in_stack_ffffffffffffeab8);
                  if (bVar1) {
                    operator_new(8);
                    mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                    std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                              ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                               (IntTy *)in_stack_ffffffffffffeab8);
                    mir::inst::Variable::Variable
                              (in_stack_ffffffffffffead0,
                               (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                               SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                               SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                               SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                    std::
                    __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x259cad);
                    local_8fc = 1;
                    std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)in_stack_ffffffffffffeb00,
                                 (key_type_conflict *)in_stack_ffffffffffffeaf8);
                    mir::inst::Variable::operator=
                              (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                    mir::inst::Variable::~Variable((Variable *)0x259cf8);
                    std::shared_ptr<mir::types::Ty>::~shared_ptr
                              ((shared_ptr<mir::types::Ty> *)0x259d05);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_ffffffffffffeac0,
                                            (char *)in_stack_ffffffffffffeab8);
                    if (bVar1) {
                      operator_new(8);
                      mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                 (IntTy *)in_stack_ffffffffffffeab8);
                      mir::inst::Variable::Variable
                                (in_stack_ffffffffffffead0,
                                 (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                      std::
                      __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x259e14);
                      local_934 = 1;
                      std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    *)in_stack_ffffffffffffeb00,
                                   (key_type_conflict *)in_stack_ffffffffffffeaf8);
                      mir::inst::Variable::operator=
                                (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                      mir::inst::Variable::~Variable((Variable *)0x259e67);
                      std::shared_ptr<mir::types::Ty>::~shared_ptr
                                ((shared_ptr<mir::types::Ty> *)0x259e74);
                      operator_new(8);
                      mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                      std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                 (IntTy *)in_stack_ffffffffffffeab8);
                      mir::inst::Variable::Variable
                                (in_stack_ffffffffffffead0,
                                 (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                 SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                      std::
                      __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x259edd);
                      local_96c = 2;
                      std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    *)in_stack_ffffffffffffeb00,
                                   (key_type_conflict *)in_stack_ffffffffffffeaf8);
                      mir::inst::Variable::operator=
                                (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                      mir::inst::Variable::~Variable((Variable *)0x259f28);
                      std::shared_ptr<mir::types::Ty>::~shared_ptr
                                ((shared_ptr<mir::types::Ty> *)0x259f35);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffeac0,
                                              (char *)in_stack_ffffffffffffeab8);
                      if (bVar1) {
                        operator_new(0x18);
                        local_9b1 = 1;
                        operator_new(8);
                        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (IntTy *)in_stack_ffffffffffffeab8);
                        mir::types::PtrTy::PtrTy
                                  (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                        local_9b1 = 0;
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (PtrTy *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::Variable
                                  (in_stack_ffffffffffffead0,
                                   (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                        std::
                        __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x25a10a);
                        local_9b8 = 1;
                        std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                      *)in_stack_ffffffffffffeb00,
                                     (key_type_conflict *)in_stack_ffffffffffffeaf8);
                        mir::inst::Variable::operator=
                                  (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::~Variable((Variable *)0x25a15d);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x25a16a);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x25a177);
                        operator_new(8);
                        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (IntTy *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::Variable
                                  (in_stack_ffffffffffffead0,
                                   (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                        std::
                        __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x25a1e0);
                        local_9ec = 2;
                        std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                      *)in_stack_ffffffffffffeb00,
                                     (key_type_conflict *)in_stack_ffffffffffffeaf8);
                        mir::inst::Variable::operator=
                                  (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::~Variable((Variable *)0x25a233);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x25a240);
                        operator_new(8);
                        mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                        std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                  ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                   (IntTy *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::Variable
                                  (in_stack_ffffffffffffead0,
                                   (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                   SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                        std::
                        __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x25a2a9);
                        local_a69[4]._5_4_ = 3;
                        std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                      *)in_stack_ffffffffffffeb00,
                                     (key_type_conflict *)in_stack_ffffffffffffeaf8);
                        mir::inst::Variable::operator=
                                  (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8);
                        mir::inst::Variable::~Variable((Variable *)0x25a2f4);
                        std::shared_ptr<mir::types::Ty>::~shared_ptr
                                  ((shared_ptr<mir::types::Ty> *)0x25a301);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_ffffffffffffeac0,
                                                (char *)in_stack_ffffffffffffeab8);
                        if (bVar1) {
                          operator_new(0x18);
                          local_a69[0]._M_local_buf[0] = '\x01';
                          operator_new(8);
                          mir::types::IntTy::IntTy((IntTy *)in_stack_ffffffffffffeac0);
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::IntTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (IntTy *)in_stack_ffffffffffffeab8);
                          mir::types::PtrTy::PtrTy
                                    (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
                          local_a69[0]._M_local_buf[0] = '\0';
                          std::shared_ptr<mir::types::Ty>::shared_ptr<mir::types::PtrTy,void>
                                    ((shared_ptr<mir::types::Ty> *)in_stack_ffffffffffffeac0,
                                     (PtrTy *)in_stack_ffffffffffffeab8);
                          mir::inst::Variable::Variable
                                    (in_stack_ffffffffffffead0,
                                     (SharedTyPtr *)in_stack_ffffffffffffeac8._M_node,
                                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x38,0),
                                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x30,0),
                                     SUB81((ulong)in_stack_ffffffffffffeac0 >> 0x28,0));
                          std::
                          __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x25a5a1);
                          local_a70 = 1;
                          std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                        *)in_stack_ffffffffffffeb00,
                                       (key_type_conflict *)in_stack_ffffffffffffeaf8);
                          mir::inst::Variable::operator=
                                    (in_stack_ffffffffffffeac0,(Variable *)in_stack_ffffffffffffeab8
                                    );
                          mir::inst::Variable::~Variable((Variable *)0x25a5ec);
                          std::shared_ptr<mir::types::Ty>::~shared_ptr
                                    ((shared_ptr<mir::types::Ty> *)0x25a5f9);
                          std::shared_ptr<mir::types::Ty>::~shared_ptr
                                    ((shared_ptr<mir::types::Ty> *)0x25a606);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                 (allocator<char> *)in_stack_ffffffffffffeaf0);
      std::allocator<char>::~allocator(&local_a91);
      peVar3 = std::
               __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x25a764);
      std::__cxx11::string::operator=((string *)&peVar3->name,local_a90);
      std::__cxx11::string::string(local_ad8,local_a90);
      getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
      std::shared_ptr<mir::inst::MirFunction>::shared_ptr
                ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
                 (shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeab8);
      insertFunc((irGenerator *)CONCAT17(in_stack_ffffffffffffeca7,in_stack_ffffffffffffeca0),
                 in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
      std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
                ((shared_ptr<mir::inst::MirFunction> *)0x25a7f9);
      std::__cxx11::string::~string(local_ab8);
      std::__cxx11::string::~string(local_ad8);
      std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x25a820);
      std::__cxx11::string::string(local_b30,local_a90);
      getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
      local_af0 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                          *)in_stack_ffffffffffffeab8,(key_type *)0x25a88e);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                    *)0x25a8b5);
      std::
      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
      ::operator=((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)in_stack_ffffffffffffeac0,
                  (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   *)in_stack_ffffffffffffeab8);
      std::__cxx11::string::~string(local_b10);
      std::__cxx11::string::~string(local_b30);
      std::__cxx11::string::~string(local_a90);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
      if (bVar1) {
        in_stack_ffffffffffffeb38 = (irGenerator *)local_b51;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                   (allocator<char> *)in_stack_ffffffffffffeaf0);
        std::allocator<char>::~allocator((allocator<char> *)local_b51);
        peVar3 = std::
                 __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25aa59);
        std::__cxx11::string::operator=((string *)&peVar3->name,(string *)(local_b51 + 1));
        std::__cxx11::string::string((string *)(local_ba8 + 0x10),(string *)(local_b51 + 1));
        getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
        in_stack_ffffffffffffeb30 = (string *)local_ba8;
        std::shared_ptr<mir::inst::MirFunction>::shared_ptr
                  ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
                   (shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeab8);
        insertFunc((irGenerator *)CONCAT17(in_stack_ffffffffffffeca7,in_stack_ffffffffffffeca0),
                   in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
        std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
                  ((shared_ptr<mir::inst::MirFunction> *)0x25aae8);
        std::__cxx11::string::~string(local_b78);
        std::__cxx11::string::~string((string *)(local_ba8 + 0x10));
        std::__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x25ab0f);
        std::__cxx11::string::string(local_bf0,(string *)(local_b51 + 1));
        getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
        local_bb0 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                    ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                            *)in_stack_ffffffffffffeab8,(key_type *)0x25ab74);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                      *)0x25ab95);
        std::
        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        ::operator=((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     *)in_stack_ffffffffffffeac0,
                    (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     *)in_stack_ffffffffffffeab8);
        std::__cxx11::string::~string(local_bd0);
        std::__cxx11::string::~string(local_bf0);
        std::__cxx11::string::~string((string *)(local_b51 + 1));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffeac0,(char *)in_stack_ffffffffffffeab8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffeb00,(char *)in_stack_ffffffffffffeaf8,
                     (allocator<char> *)in_stack_ffffffffffffeaf0);
          std::allocator<char>::~allocator(&local_c11);
          peVar3 = std::
                   __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x25ad2a);
          std::__cxx11::string::operator=((string *)&peVar3->name,local_c10);
          std::__cxx11::string::string((string *)(local_c68 + 0x10),local_c10);
          getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
          in_stack_ffffffffffffeb00 = (FunctionTy *)local_c68;
          std::shared_ptr<mir::inst::MirFunction>::shared_ptr
                    ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
                     (shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeab8);
          insertFunc((irGenerator *)CONCAT17(in_stack_ffffffffffffeca7,in_stack_ffffffffffffeca0),
                     in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
          std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
                    ((shared_ptr<mir::inst::MirFunction> *)0x25adb9);
          std::__cxx11::string::~string(local_c38);
          std::__cxx11::string::~string((string *)(local_c68 + 0x10));
          peVar3 = std::
                   __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x25ade0);
          in_stack_ffffffffffffeaf0 = (MirFunction *)&peVar3->variables;
          in_stack_ffffffffffffeaf8 = (iterator)(in_RDI + 8);
          std::__cxx11::string::string(local_cb0,local_c10);
          getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
          in_stack_ffffffffffffeae8 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                       *)in_stack_ffffffffffffeab8,(key_type *)0x25ae45);
          local_c70 = in_stack_ffffffffffffeae8._M_node;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                        *)0x25ae66);
          std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::operator=((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)in_stack_ffffffffffffeac0,
                      (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)in_stack_ffffffffffffeab8);
          std::__cxx11::string::~string(local_c90);
          std::__cxx11::string::~string(local_cb0);
          std::__cxx11::string::~string(local_c10);
        }
      }
    }
    std::__cxx11::string::string((string *)(local_d00 + 0x10),local_40);
    getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
    in_stack_ffffffffffffeae0 = (PtrTy *)local_d00;
    std::shared_ptr<mir::inst::MirFunction>::shared_ptr
              ((shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeac0,
               (shared_ptr<mir::inst::MirFunction> *)in_stack_ffffffffffffeab8);
    insertFunc((irGenerator *)CONCAT17(in_stack_ffffffffffffeca7,in_stack_ffffffffffffeca0),
               in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
    std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
              ((shared_ptr<mir::inst::MirFunction> *)0x25b00a);
    std::__cxx11::string::~string(local_cd0);
    std::__cxx11::string::~string((string *)(local_d00 + 0x10));
    peVar3 = std::
             __shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25b031);
    in_stack_ffffffffffffead0 = (Variable *)&peVar3->variables;
    in_stack_ffffffffffffead8 = (SharedTyPtr *)(in_RDI + 8);
    std::__cxx11::string::string(local_d48,local_40);
    getFunctionName(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
    in_stack_ffffffffffffeac8 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                 *)in_stack_ffffffffffffeab8,(key_type *)0x25b096);
    local_d08 = in_stack_ffffffffffffeac8._M_node;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x25b0b7);
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::operator=((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)in_stack_ffffffffffffeac0,
                (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)in_stack_ffffffffffffeab8);
    std::__cxx11::string::~string(local_d28);
    std::__cxx11::string::~string(local_d48);
    std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
              ((shared_ptr<mir::types::FunctionTy> *)0x25b0f1);
    std::shared_ptr<mir::inst::MirFunction>::~shared_ptr
              ((shared_ptr<mir::inst::MirFunction> *)0x25b0fe);
    std::__cxx11::string::~string(local_40);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_18);
  }
  *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(in_RDI + 0x9c);
  *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)(in_RDI + 0x98);
  std::__cxx11::string::string(local_d68,(string *)(in_RDI + 0xb8));
  ir_declare_function(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,kind);
  std::__cxx11::string::~string(local_d68);
  return;
}

Assistant:

void irGenerator::ir_begin_of_program() {
  for (string funcName : externalFuncName) {
    shared_ptr<mir::inst::MirFunction> func;
    shared_ptr<FunctionTy> type;

    if (funcName == "getint") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new IntTy()), {}, true));
    } else if (funcName == "getch") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new IntTy()), {}, true));
    } else if (funcName == "getarray") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new IntTy()),
          {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())))}, true));
    } else if (funcName == "putint") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "putch") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "putarray") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new IntTy()),
                          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy)))},
                         true));
    } else if (funcName == "putf") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
                          SharedTyPtr(new RestParamTy())},
                         true));
    } else if (funcName == "starttime") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "stoptime") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()), {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "malloc") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
                         {SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "calloc") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))),
          {SharedTyPtr(new IntTy()), SharedTyPtr(new IntTy())}, true));
    } else if (funcName == "memset") {
      type = shared_ptr<FunctionTy>(
          new FunctionTy(SharedTyPtr(new VoidTy()),
                         {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))),
                          SharedTyPtr(new IntTy()), SharedTyPtr(new IntTy())},
                         true));
    } else if (funcName == "free") {
      type = shared_ptr<FunctionTy>(new FunctionTy(
          SharedTyPtr(new VoidTy()),
          {SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy)))}, true));
    }

    func = shared_ptr<mir::inst::MirFunction>(
        new mir::inst::MirFunction(funcName, type));

    if (funcName == "getarray") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "putint") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "putch") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "putarray") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[2] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
    } else if (funcName == "putf") {
      func->variables[1] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
      func->variables[2] =
          Variable(SharedTyPtr(new RestParamTy()), true, false);
    } else if (funcName == "starttime") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "stoptime") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
    } else if (funcName == "malloc") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "calloc") {
      func->variables[1] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[2] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "memset") {
      func->variables[1] = Variable(
          SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy()))), true, false);
      func->variables[2] = Variable(SharedTyPtr(new IntTy()), true, false);
      func->variables[3] = Variable(SharedTyPtr(new IntTy()), true, false);
    } else if (funcName == "free") {
      func->variables[1] =
          Variable(SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy))), true, false);
    }

    if (funcName == "putf") {
      string trueName = "printf";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    } else if (funcName == "starttime") {
      string trueName = "_sysy_starttime";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    } else if (funcName == "stoptime") {
      string trueName = "_sysy_stoptime";
      func->name = trueName;
      insertFunc(getFunctionName(trueName), func);
      _package.functions.find(getFunctionName(trueName))->second.variables =
          func->variables;
    }

    insertFunc(getFunctionName(funcName), func);
    _package.functions.find(getFunctionName(funcName))->second.variables =
        func->variables;
  }

  _nowLabelId = _InitLabelId;
  _nowStringId = _InitStringId;

  ir_declare_function(_GlobalInitFuncName, symbol::SymbolKind::INT);
}